

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
 __thiscall
nanojson3::internal::
key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>
::
operate_emplace<(nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>::operate_insert_option)1,std::__cxx11::string_const&,int&>
          (key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,int *value)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
  pVar4;
  bool local_b1;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  local_b0;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  local_a8;
  tuple<int_&> local_a0;
  undefined1 local_98 [15];
  bool local_89;
  json local_88;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  local_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
  *local_48;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  local_40;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  local_38;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  it;
  int *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  *this_local;
  bool local_10;
  
  it._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
        *)value;
  local_40._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
        *)std::
          vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
          ::begin((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
                   *)this);
  local_48 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
              *)std::
                vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
                ::end((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
                       *)this);
  local_38 = operate_find<(nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>::operate_find_option)0,__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,nanojson3::json>*,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>,std::__cxx11::string>
                       (this,local_40,
                        (__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
                         )local_48,key);
  local_50._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
        *)std::
          vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
          ::end((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
                 *)this);
  bVar1 = __gnu_cxx::operator!=(&local_38,&local_50);
  if (bVar1) {
    json::json<int_&,_nullptr>(&local_88,(int *)it._M_current);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
             ::operator->(&local_38);
    json::operator=(&ppVar2->second,&local_88);
    json::~json(&local_88);
    local_89 = false;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_&,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
                *)&this_local,&local_38,&local_89);
    uVar3 = extraout_RDX;
  }
  else {
    std::forward_as_tuple<std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    std::forward_as_tuple<int&>((int *)&local_a0);
    std::
    vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>
    ::
    emplace_back<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<int&>>
              ((vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>
                *)this,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_98,&local_a0);
    local_b0._M_current =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
          *)std::
            vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
            ::end((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>
                   *)this);
    local_a8 = __gnu_cxx::
               __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
               ::operator-(&local_b0,1);
    local_b1 = true;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
                *)&this_local,&local_a8,&local_b1);
    uVar3 = extraout_RDX_00;
  }
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10;
  pVar4.first._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
        *)this_local;
  return pVar4;
}

Assistant:

[[nodiscard]] std::pair<iterator, bool> operate_emplace(Key&& key, Value&&... value)
            {
                if (auto it = operate_find(begin(), end(), key); it != end())
                {
                    if constexpr (on_already_exists == or_assign) it->second = mapped_type(std::forward<decltype(value)>(value)...);
                    return {it, false};
                }
                else
                {
                    base_container::emplace_back(std::piecewise_construct, std::forward_as_tuple(std::forward<decltype(key)>(key)), std::forward_as_tuple(std::forward<decltype(value)>(value)...));
                    return {base_container::end() - 1, true};
                }
            }